

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
spoa::Graph::GenerateMultipleSequenceAlignment_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Graph *this,bool include_consensus)

{
  pointer ppNVar1;
  Node *this_00;
  pointer ppNVar2;
  ulong uVar3;
  uint32_t row_size;
  string row;
  vector<unsigned_int,_std::allocator<unsigned_int>_> node_id_to_column;
  uint32_t local_6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_6c = 0;
  InitializeMultipleSequenceAlignment(&local_48,this,&local_6c);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->sequences_).
      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->sequences_).
      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_68,(char)local_6c);
      this_00 = (this->sequences_).
                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar3];
      do {
        local_68._M_dataplus._M_p
        [local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[this_00->id]] =
             (char)(this->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[this_00->code];
        this_00 = Node::Successor(this_00,(uint32_t)uVar3);
      } while (this_00 != (Node *)0x0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      uVar3 = (ulong)((uint32_t)uVar3 + 1);
    } while (uVar3 < (ulong)((long)(this->sequences_).
                                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->sequences_).
                                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (include_consensus) {
    TraverseHeaviestBundle(this);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_68,(char)local_6c);
    ppNVar1 = (this->consensus_).
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppNVar2 = (this->consensus_).
                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppNVar2 != ppNVar1;
        ppNVar2 = ppNVar2 + 1) {
      local_68._M_dataplus._M_p
      [local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start[(*ppNVar2)->id]] =
           (char)(this->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(*ppNVar2)->code];
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Graph::GenerateMultipleSequenceAlignment(
    bool include_consensus) {
  std::uint32_t row_size = 0;
  auto node_id_to_column = InitializeMultipleSequenceAlignment(&row_size);

  std::vector<std::string> dst;
  for (std::uint32_t i = 0; i < sequences_.size(); ++i) {
    std::string row(row_size, '-');
    auto it = sequences_[i];
    while (true) {
      row[node_id_to_column[it->id]] = decoder_[it->code];
      if (!(it = it->Successor(i))) {
        break;
      }
    }
    dst.emplace_back(row);
  }
  if (include_consensus) {
    TraverseHeaviestBundle();
    std::string row(row_size, '-');
    for (const auto& it : consensus_) {
      row[node_id_to_column[it->id]] = decoder_[it->code];
    }
    dst.emplace_back(row);
  }

  return dst;
}